

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void __thiscall
DivideTest<unsigned_short>::test_pow2_numerators<(libdivide::Branching)0>
          (DivideTest<unsigned_short> *this,unsigned_short denom,
          divider<unsigned_short,_(libdivide::Branching)0> *the_divider)

{
  sbyte sVar1;
  int iVar2;
  int i;
  int iVar3;
  
  for (iVar3 = 1; iVar3 != 0x10; iVar3 = iVar3 + 1) {
    sVar1 = ((byte)iVar3 < 0x21) * (' ' - (byte)iVar3);
    for (iVar2 = 0; iVar2 != 3; iVar2 = iVar2 + 1) {
      test_one<(libdivide::Branching)0>
                (this,(short)((uint)(0xffff << sVar1) >> sVar1) + (short)iVar2,denom,the_divider);
    }
  }
  return;
}

Assistant:

void test_pow2_numerators(T denom, const divider<T, ALGO> &the_divider) {
        // test power of 2 numerators: 2^i-1, 2^i, 2^i+1
        for (int i = 1; i < limits::digits; i++) {
            for (int j = -1; j <= 1; j++) {
                T numerator = static_cast<T>((static_cast<T>(1) << i) + j);
                test_one(numerator, denom, the_divider);

                if (limits::is_signed) {
                    test_one(-numerator, denom, the_divider);
                }
            }
        }
    }